

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O0

int __thiscall deqp::gls::FragOpInteractionCase::init(FragOpInteractionCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RandomShaderProgram *this_00;
  size_type sVar6;
  ReferenceContext *this_01;
  GLContext *this_02;
  TestLog *log;
  ShaderInput **local_d0;
  Vector<int,_2> local_5c;
  Vector<int,_4> local_54;
  ProgramGenerator local_41;
  int local_40;
  int iStack_3c;
  ProgramGenerator generator;
  int viewportY;
  int viewportX;
  int viewportH;
  undefined1 local_20 [4];
  int viewportW;
  Random rnd;
  FragOpInteractionCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,(this->m_params).seed ^ 0x232faac);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar2));
  iVar2 = de::min<int>(iVar2,0x40);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = de::min<int>(iVar3,0x40);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_01,iVar4));
  iStack_3c = de::Random::getInt((Random *)local_20,0,iVar4 - iVar2);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_02,iVar4));
  local_40 = de::Random::getInt((Random *)local_20,0,iVar4 - iVar3);
  rsg::ProgramGenerator::ProgramGenerator(&local_41);
  rsg::ProgramGenerator::generate
            (&local_41,&this->m_params,&this->m_vertexShader,&this->m_fragmentShader);
  rsg::computeUnifiedUniforms
            (&this->m_vertexShader,&this->m_fragmentShader,&this->m_unifiedUniforms);
  this_00 = (RandomShaderProgram *)operator_new(600);
  sVar6 = std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::size
                    (&this->m_unifiedUniforms);
  bVar1 = std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::empty
                    (&this->m_unifiedUniforms);
  if (bVar1) {
    local_d0 = (ShaderInput **)0x0;
  }
  else {
    local_d0 = std::vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>::
               operator[](&this->m_unifiedUniforms,0);
  }
  RandomShaderProgram::RandomShaderProgram
            (this_00,&this->m_vertexShader,&this->m_fragmentShader,(int)sVar6,local_d0);
  this->m_program = this_00;
  this_01 = (ReferenceContext *)operator_new(0x6280);
  ReferenceContext::ReferenceContext(this_01,this->m_renderCtx,iVar2,iVar3);
  this->m_referenceCtx = this_01;
  this_02 = (GLContext *)operator_new(0x170);
  context = this->m_renderCtx;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  tcu::Vector<int,_4>::Vector(&local_54,iStack_3c,local_40,iVar2,iVar3);
  sglr::GLContext::GLContext(this_02,context,log,3,&local_54);
  this->m_glCtx = this_02;
  dVar5 = sglr::ReferenceContext::createProgram
                    (&this->m_referenceCtx->context,&this->m_program->super_ShaderProgram);
  this->m_refProgram = dVar5;
  dVar5 = (*(this->m_glCtx->super_Context)._vptr_Context[0x75])(this->m_glCtx,this->m_program);
  this->m_glProgram = dVar5;
  tcu::Vector<int,_2>::Vector(&local_5c,iVar2,iVar3);
  *&(this->m_viewportSize).m_data = local_5c.m_data;
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  rsg::ProgramGenerator::~ProgramGenerator(&local_41);
  de::Random::~Random((Random *)local_20);
  return extraout_EAX;
}

Assistant:

void FragOpInteractionCase::init (void)
{
	de::Random				rnd				(m_params.seed ^ 0x232faac);
	const int				viewportW		= de::min<int>(m_renderCtx.getRenderTarget().getWidth(),	VIEWPORT_WIDTH);
	const int				viewportH		= de::min<int>(m_renderCtx.getRenderTarget().getHeight(),	VIEWPORT_HEIGHT);
	const int				viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportW);
	const int				viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportH);

	rsg::ProgramGenerator	generator;

	generator.generate(m_params, m_vertexShader, m_fragmentShader);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, m_unifiedUniforms);

	try
	{
		DE_ASSERT(!m_program);
		m_program = new gls::RandomShaderProgram(m_vertexShader, m_fragmentShader, (int)m_unifiedUniforms.size(), m_unifiedUniforms.empty() ? DE_NULL : &m_unifiedUniforms[0]);

		DE_ASSERT(!m_referenceCtx);
		m_referenceCtx = new ReferenceContext(m_renderCtx, viewportW, viewportH);

		DE_ASSERT(!m_glCtx);
		m_glCtx = new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS|sglr::GLCONTEXT_LOG_PROGRAMS, IVec4(viewportX, viewportY, viewportW, viewportH));

		m_refProgram	= m_referenceCtx->context.createProgram(m_program);
		m_glProgram		= m_glCtx->createProgram(m_program);

		m_viewportSize	= tcu::IVec2(viewportW, viewportH);
		m_iterNdx		= 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Save some memory by cleaning up stuff.
		FragOpInteractionCase::deinit();
		throw;
	}
}